

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O0

int process_tracelog(char *fname,void *userdata)

{
  bool bVar1;
  char *pcVar2;
  FILE *pFVar3;
  int iVar4;
  EventEnum EVar5;
  __off_t total;
  __off_t _Var6;
  int *piVar7;
  char *pcVar8;
  off_t fdsize;
  off_t fdoffset;
  int eos;
  int retval;
  void *userdata_local;
  char *fname_local;
  
  fdoffset._4_4_ = 1;
  bVar1 = false;
  iVar4 = init_altrace_playback(fname,userdata);
  if (iVar4 == 0) {
    fname_local._4_4_ = 0;
  }
  else {
    fdsize = lseek(logfd,0,1);
    total = lseek(logfd,0,2);
    _Var6 = lseek(logfd,fdsize,0);
    pFVar3 = _stderr;
    pcVar2 = GAppName;
    if (((_Var6 == -1) || (fdsize == -1)) || (total == -1)) {
      piVar7 = __errno_location();
      pcVar8 = strerror(*piVar7);
      fprintf(pFVar3,"%s: Failed to seek in file: %s\n",pcVar2,pcVar8);
      io_failure = 1;
    }
    while (!bVar1) {
      if ((io_failure == 0) &&
         (fdsize = lseek(logfd,0,1), pFVar3 = _stderr, pcVar2 = GAppName, fdsize == -1)) {
        piVar7 = __errno_location();
        pcVar8 = strerror(*piVar7);
        fprintf(pFVar3,"%s: Failed to get current file offset: %s\n",pcVar2,pcVar8);
        io_failure = 1;
      }
      if (io_failure != 0) {
        fdoffset._4_4_ = 0;
        break;
      }
      iVar4 = visit_progress(guserdata,fdsize,total);
      if (iVar4 == 0) {
        fprintf(_stderr,"%s: Application cancelled file processing!\n",GAppName);
        visit_eos(guserdata,'\0',0);
        fdoffset._4_4_ = -1;
        break;
      }
      EVar5 = IO_EVENTENUM();
      switch(EVar5) {
      case ALEE_EOS:
        decode_eos();
        bVar1 = true;
        break;
      case ALEE_ALERROR_TRIGGERED:
        decode_al_error_event();
        break;
      case ALEE_ALCERROR_TRIGGERED:
        decode_alc_error_event();
        break;
      case ALEE_NEW_CALLSTACK_SYMS:
        decode_callstack_syms_event();
        break;
      default:
        if (io_failure == 0) {
          visit_eos(guserdata,'\0',0);
        }
        fdoffset._4_4_ = 0;
        bVar1 = true;
        break;
      case ALEE_DEVICE_STATE_CHANGED_INT:
        decode_device_state_changed_int();
        break;
      case ALEE_CONTEXT_STATE_CHANGED_ENUM:
        decode_context_state_changed_enum();
        break;
      case ALEE_CONTEXT_STATE_CHANGED_FLOAT:
        decode_context_state_changed_float();
        break;
      case ALEE_CONTEXT_STATE_CHANGED_STRING:
        decode_context_state_changed_string();
        break;
      case ALEE_LISTENER_STATE_CHANGED_FLOATV:
        decode_listener_state_changed_floatv();
        break;
      case ALEE_SOURCE_STATE_CHANGED_BOOL:
        decode_source_state_changed_bool();
        break;
      case ALEE_SOURCE_STATE_CHANGED_ENUM:
        decode_source_state_changed_enum();
        break;
      case ALEE_SOURCE_STATE_CHANGED_INT:
        decode_source_state_changed_int();
        break;
      case ALEE_SOURCE_STATE_CHANGED_UINT:
        decode_source_state_changed_uint();
        break;
      case ALEE_SOURCE_STATE_CHANGED_FLOAT:
        decode_source_state_changed_float();
        break;
      case ALEE_SOURCE_STATE_CHANGED_FLOAT3:
        decode_source_state_changed_float3();
        break;
      case ALEE_BUFFER_STATE_CHANGED_INT:
        decode_buffer_state_changed_int();
        break;
      case ALEE_alcGetCurrentContext:
        decode_alcGetCurrentContext();
        break;
      case ALEE_alcGetContextsDevice:
        decode_alcGetContextsDevice();
        break;
      case ALEE_alcIsExtensionPresent:
        decode_alcIsExtensionPresent();
        break;
      case ALEE_alcGetProcAddress:
        decode_alcGetProcAddress();
        break;
      case ALEE_alcGetEnumValue:
        decode_alcGetEnumValue();
        break;
      case ALEE_alcGetString:
        decode_alcGetString();
        break;
      case ALEE_alcCaptureOpenDevice:
        decode_alcCaptureOpenDevice();
        break;
      case ALEE_alcCaptureCloseDevice:
        decode_alcCaptureCloseDevice();
        break;
      case ALEE_alcOpenDevice:
        decode_alcOpenDevice();
        break;
      case ALEE_alcCloseDevice:
        decode_alcCloseDevice();
        break;
      case ALEE_alcCreateContext:
        decode_alcCreateContext();
        break;
      case ALEE_alcMakeContextCurrent:
        decode_alcMakeContextCurrent();
        break;
      case ALEE_alcProcessContext:
        decode_alcProcessContext();
        break;
      case ALEE_alcSuspendContext:
        decode_alcSuspendContext();
        break;
      case ALEE_alcDestroyContext:
        decode_alcDestroyContext();
        break;
      case ALEE_alcGetError:
        decode_alcGetError();
        break;
      case ALEE_alcGetIntegerv:
        decode_alcGetIntegerv();
        break;
      case ALEE_alcCaptureStart:
        decode_alcCaptureStart();
        break;
      case ALEE_alcCaptureStop:
        decode_alcCaptureStop();
        break;
      case ALEE_alcCaptureSamples:
        decode_alcCaptureSamples();
        break;
      case ALEE_alDopplerFactor:
        decode_alDopplerFactor();
        break;
      case ALEE_alDopplerVelocity:
        decode_alDopplerVelocity();
        break;
      case ALEE_alSpeedOfSound:
        decode_alSpeedOfSound();
        break;
      case ALEE_alDistanceModel:
        decode_alDistanceModel();
        break;
      case ALEE_alEnable:
        decode_alEnable();
        break;
      case ALEE_alDisable:
        decode_alDisable();
        break;
      case ALEE_alIsEnabled:
        decode_alIsEnabled();
        break;
      case ALEE_alGetString:
        decode_alGetString();
        break;
      case ALEE_alGetBooleanv:
        decode_alGetBooleanv();
        break;
      case ALEE_alGetIntegerv:
        decode_alGetIntegerv();
        break;
      case ALEE_alGetFloatv:
        decode_alGetFloatv();
        break;
      case ALEE_alGetDoublev:
        decode_alGetDoublev();
        break;
      case ALEE_alGetBoolean:
        decode_alGetBoolean();
        break;
      case ALEE_alGetInteger:
        decode_alGetInteger();
        break;
      case ALEE_alGetFloat:
        decode_alGetFloat();
        break;
      case ALEE_alGetDouble:
        decode_alGetDouble();
        break;
      case ALEE_alIsExtensionPresent:
        decode_alIsExtensionPresent();
        break;
      case ALEE_alGetError:
        decode_alGetError();
        break;
      case ALEE_alGetProcAddress:
        decode_alGetProcAddress();
        break;
      case ALEE_alGetEnumValue:
        decode_alGetEnumValue();
        break;
      case ALEE_alListenerfv:
        decode_alListenerfv();
        break;
      case ALEE_alListenerf:
        decode_alListenerf();
        break;
      case ALEE_alListener3f:
        decode_alListener3f();
        break;
      case ALEE_alListeneriv:
        decode_alListeneriv();
        break;
      case ALEE_alListeneri:
        decode_alListeneri();
        break;
      case ALEE_alListener3i:
        decode_alListener3i();
        break;
      case ALEE_alGetListenerfv:
        decode_alGetListenerfv();
        break;
      case ALEE_alGetListenerf:
        decode_alGetListenerf();
        break;
      case ALEE_alGetListener3f:
        decode_alGetListener3f();
        break;
      case ALEE_alGetListeneri:
        decode_alGetListeneri();
        break;
      case ALEE_alGetListeneriv:
        decode_alGetListeneriv();
        break;
      case ALEE_alGetListener3i:
        decode_alGetListener3i();
        break;
      case ALEE_alGenSources:
        decode_alGenSources();
        break;
      case ALEE_alDeleteSources:
        decode_alDeleteSources();
        break;
      case ALEE_alIsSource:
        decode_alIsSource();
        break;
      case ALEE_alSourcefv:
        decode_alSourcefv();
        break;
      case ALEE_alSourcef:
        decode_alSourcef();
        break;
      case ALEE_alSource3f:
        decode_alSource3f();
        break;
      case ALEE_alSourceiv:
        decode_alSourceiv();
        break;
      case ALEE_alSourcei:
        decode_alSourcei();
        break;
      case ALEE_alSource3i:
        decode_alSource3i();
        break;
      case ALEE_alGetSourcefv:
        decode_alGetSourcefv();
        break;
      case ALEE_alGetSourcef:
        decode_alGetSourcef();
        break;
      case ALEE_alGetSource3f:
        decode_alGetSource3f();
        break;
      case ALEE_alGetSourceiv:
        decode_alGetSourceiv();
        break;
      case ALEE_alGetSourcei:
        decode_alGetSourcei();
        break;
      case ALEE_alGetSource3i:
        decode_alGetSource3i();
        break;
      case ALEE_alSourcePlay:
        decode_alSourcePlay();
        break;
      case ALEE_alSourcePlayv:
        decode_alSourcePlayv();
        break;
      case ALEE_alSourcePause:
        decode_alSourcePause();
        break;
      case ALEE_alSourcePausev:
        decode_alSourcePausev();
        break;
      case ALEE_alSourceRewind:
        decode_alSourceRewind();
        break;
      case ALEE_alSourceRewindv:
        decode_alSourceRewindv();
        break;
      case ALEE_alSourceStop:
        decode_alSourceStop();
        break;
      case ALEE_alSourceStopv:
        decode_alSourceStopv();
        break;
      case ALEE_alSourceQueueBuffers:
        decode_alSourceQueueBuffers();
        break;
      case ALEE_alSourceUnqueueBuffers:
        decode_alSourceUnqueueBuffers();
        break;
      case ALEE_alGenBuffers:
        decode_alGenBuffers();
        break;
      case ALEE_alDeleteBuffers:
        decode_alDeleteBuffers();
        break;
      case ALEE_alIsBuffer:
        decode_alIsBuffer();
        break;
      case ALEE_alBufferData:
        decode_alBufferData();
        break;
      case ALEE_alBufferfv:
        decode_alBufferfv();
        break;
      case ALEE_alBufferf:
        decode_alBufferf();
        break;
      case ALEE_alBuffer3f:
        decode_alBuffer3f();
        break;
      case ALEE_alBufferiv:
        decode_alBufferiv();
        break;
      case ALEE_alBufferi:
        decode_alBufferi();
        break;
      case ALEE_alBuffer3i:
        decode_alBuffer3i();
        break;
      case ALEE_alGetBufferfv:
        decode_alGetBufferfv();
        break;
      case ALEE_alGetBufferf:
        decode_alGetBufferf();
        break;
      case ALEE_alGetBuffer3f:
        decode_alGetBuffer3f();
        break;
      case ALEE_alGetBufferi:
        decode_alGetBufferi();
        break;
      case ALEE_alGetBuffer3i:
        decode_alGetBuffer3i();
        break;
      case ALEE_alGetBufferiv:
        decode_alGetBufferiv();
        break;
      case ALEE_alTracePushScope:
        decode_alTracePushScope();
        break;
      case ALEE_alTracePopScope:
        decode_alTracePopScope();
        break;
      case ALEE_alTraceMessage:
        decode_alTraceMessage();
        break;
      case ALEE_alTraceBufferLabel:
        decode_alTraceBufferLabel();
        break;
      case ALEE_alTraceSourceLabel:
        decode_alTraceSourceLabel();
        break;
      case ALEE_alcTraceDeviceLabel:
        decode_alcTraceDeviceLabel();
        break;
      case ALEE_alcTraceContextLabel:
        decode_alcTraceContextLabel();
      }
    }
    if (io_failure != 0) {
      visit_eos(guserdata,'\0',0);
    }
    quit_altrace_playback();
    fname_local._4_4_ = fdoffset._4_4_;
  }
  return fname_local._4_4_;
}

Assistant:

int process_tracelog(const char *fname, void *userdata)
{
    int retval = 1;
    int eos = 0;
    off_t fdoffset = 0;
    off_t fdsize = 0;

    if (!init_altrace_playback(fname, userdata)) {
        return 0;
    }

    fdoffset = lseek(logfd, 0, SEEK_CUR);
    fdsize = lseek(logfd, 0, SEEK_END);
    if ((lseek(logfd, fdoffset, SEEK_SET) == -1) || (fdoffset == -1) || (fdsize == -1)) {
        fprintf(stderr, "%s: Failed to seek in file: %s\n", GAppName, strerror(errno));
        io_failure = 1;
    }

    while (!eos) {
        if (!io_failure) {
            fdoffset = lseek(logfd, 0, SEEK_CUR);
            if (fdoffset == -1) {
                fprintf(stderr, "%s: Failed to get current file offset: %s\n", GAppName, strerror(errno));
                io_failure = 1;
            }
        }

        if (io_failure) {
            retval = 0;
            eos = 1;
            break;
        }

        if (!visit_progress(guserdata, fdoffset, fdsize)) {
            fprintf(stderr, "%s: Application cancelled file processing!\n", GAppName);
            visit_eos(guserdata, AL_FALSE, 0);
            retval = -1;
            eos = 1;
            break;
        }

        switch (IO_EVENTENUM()) {
            #define ENTRYPOINT(ret,name,params,args,numargs,visitparams,visitargs) case ALEE_##name: decode_##name(); break;
            #include "altrace_entrypoints.h"

            case ALEE_NEW_CALLSTACK_SYMS:
                decode_callstack_syms_event();
                break;

            case ALEE_ALERROR_TRIGGERED:
                decode_al_error_event();
                break;

            case ALEE_ALCERROR_TRIGGERED:
                decode_alc_error_event();
                break;

            case ALEE_DEVICE_STATE_CHANGED_INT:
                decode_device_state_changed_int();
                break;

            case ALEE_CONTEXT_STATE_CHANGED_ENUM:
                decode_context_state_changed_enum();
                break;

            case ALEE_CONTEXT_STATE_CHANGED_FLOAT:
                decode_context_state_changed_float();
                break;

            case ALEE_CONTEXT_STATE_CHANGED_STRING:
                decode_context_state_changed_string();
                break;

            case ALEE_LISTENER_STATE_CHANGED_FLOATV:
                decode_listener_state_changed_floatv();
                break;

            case ALEE_SOURCE_STATE_CHANGED_BOOL:
                decode_source_state_changed_bool();
                break;

            case ALEE_SOURCE_STATE_CHANGED_ENUM:
                decode_source_state_changed_enum();
                break;

            case ALEE_SOURCE_STATE_CHANGED_INT:
                decode_source_state_changed_int();
                break;

            case ALEE_SOURCE_STATE_CHANGED_UINT:
                decode_source_state_changed_uint();
                break;

            case ALEE_SOURCE_STATE_CHANGED_FLOAT:
                decode_source_state_changed_float();
                break;

            case ALEE_SOURCE_STATE_CHANGED_FLOAT3:
                decode_source_state_changed_float3();
                break;

            case ALEE_BUFFER_STATE_CHANGED_INT:
                decode_buffer_state_changed_int();
                break;

            case ALEE_EOS:
                decode_eos();
                eos = 1;
                break;

            default:
                if (!io_failure) {
                    visit_eos(guserdata, AL_FALSE, 0);
                }
                retval = 0;
                eos = 1;
                break;
        }
    }

    if (io_failure) {
        visit_eos(guserdata, AL_FALSE, 0);
    }

    quit_altrace_playback();

    return retval;
}